

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test> *this
          )

{
  Test *this_00;
  ParameterizedTestFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test> *this_local;
  
  WithParamInterface<unsigned_char>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x120);
  anon_unknown.dwarf_1b7ec4::NopImpliedFixture_nop_implied_Test::NopImpliedFixture_nop_implied_Test
            ((NopImpliedFixture_nop_implied_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }